

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

void __thiscall leveldb::log::LogTest::Write(LogTest *this,string *msg)

{
  AssertHelper *this_00;
  bool bVar1;
  undefined8 *puVar2;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  internal local_70 [8];
  undefined8 *local_68;
  undefined1 local_60 [16];
  string local_50;
  
  bVar1 = this->reading_;
  local_70[0] = (internal)(bVar1 ^ 1);
  local_68 = (undefined8 *)0x0;
  if (bVar1 != false) {
    testing::Message::Message((Message *)&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_head_impl + 0x10),"Write() after starting to read",0x1e);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,local_70,(AssertionResult *)"!reading_","false","true",in_R9);
    this_00 = (AssertHelper *)(local_60 + 8);
    testing::internal::AssertHelper::AssertHelper
              (this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
               ,0x3a,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(this_00,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  puVar2 = local_68;
  if (local_68 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_68 != local_68 + 2) {
      operator_delete((undefined8 *)*local_68);
    }
    operator_delete(puVar2);
  }
  if (bVar1 == false) {
    local_50._M_dataplus._M_p = (msg->_M_dataplus)._M_p;
    local_50._M_string_length = msg->_M_string_length;
    Writer::AddRecord((Writer *)local_60,(Slice *)this->writer_);
    if ((WritableFile *)local_60._0_8_ != (WritableFile *)0x0) {
      operator_delete__((void *)local_60._0_8_);
    }
  }
  return;
}

Assistant:

void Write(const std::string& msg) {
    ASSERT_TRUE(!reading_) << "Write() after starting to read";
    writer_->AddRecord(Slice(msg));
  }